

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_true>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  _func_int **pp_Var13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  undefined1 (*pauVar20) [32];
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_27c0 [32];
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  uint uStack_26a4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  uint uStack_2684;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  uint uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong auStack_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar24 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    auVar24 = vpcmpeqd_avx2(auVar24,(undefined1  [32])valid_i->field_0);
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar28._16_4_ = 0x7fffffff;
      auVar28._20_4_ = 0x7fffffff;
      auVar28._24_4_ = 0x7fffffff;
      auVar28._28_4_ = 0x7fffffff;
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      auVar29._16_4_ = 0x219392ef;
      auVar29._20_4_ = 0x219392ef;
      auVar29._24_4_ = 0x219392ef;
      auVar29._28_4_ = 0x219392ef;
      auVar27 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar28);
      auVar27 = vcmpps_avx(auVar27,auVar29,1);
      auVar3 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar29,auVar27);
      auVar25 = vrcpps_avx(auVar3);
      auVar5 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40));
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = &DAT_3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar35._16_4_ = 0x3f800000;
      auVar35._20_4_ = 0x3f800000;
      auVar35._24_4_ = 0x3f800000;
      auVar35._28_4_ = 0x3f800000;
      auVar27 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar28);
      auVar27 = vcmpps_avx(auVar27,auVar29,1);
      auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar29,auVar27);
      auVar30 = vrcpps_avx(auVar4);
      auVar27 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar28);
      auVar27 = vcmpps_avx(auVar27,auVar29,1);
      auVar27 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar29,auVar27);
      auVar28 = vrcpps_avx(auVar27);
      auVar9 = vfnmadd213ps_fma(auVar3,auVar25,auVar35);
      auVar10 = vfnmadd213ps_fma(auVar4,auVar30,auVar35);
      auVar11 = vfnmadd213ps_fma(auVar27,auVar28,auVar35);
      auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar28,auVar28);
      auVar46 = ZEXT1664(auVar11);
      auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar30,auVar30);
      auVar45 = ZEXT1664(auVar10);
      auVar27 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar47 = ZEXT3264(local_1e80);
      local_2660 = vblendvps_avx(local_1e80,auVar27,auVar24);
      auVar27._8_4_ = 0xff800000;
      auVar27._0_8_ = 0xff800000ff800000;
      auVar27._12_4_ = 0xff800000;
      auVar27._16_4_ = 0xff800000;
      auVar27._20_4_ = 0xff800000;
      auVar27._24_4_ = 0xff800000;
      auVar27._28_4_ = 0xff800000;
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar25,auVar25);
      auVar44 = ZEXT1664(auVar9);
      local_27c0 = vblendvps_avx(auVar27,auVar5,auVar24);
      puVar19 = auStack_2608 + 1;
      uStack_2664 = *(uint *)(ray + 0x1c) ^ 0x80000000;
      pauVar20 = (undefined1 (*) [32])local_1e40;
      local_2680 = auVar11._0_4_ * -*(float *)ray;
      fStack_267c = auVar11._4_4_ * -*(float *)(ray + 4);
      fStack_2678 = auVar11._8_4_ * -*(float *)(ray + 8);
      fStack_2674 = auVar11._12_4_ * -*(float *)(ray + 0xc);
      fStack_2670 = -*(float *)(ray + 0x10) * 0.0;
      fStack_266c = -*(float *)(ray + 0x14) * 0.0;
      fStack_2668 = -*(float *)(ray + 0x18) * 0.0;
      uStack_2684 = *(uint *)(ray + 0x3c) ^ 0x80000000;
      local_26a0 = auVar10._0_4_ * -*(float *)(ray + 0x20);
      fStack_269c = auVar10._4_4_ * -*(float *)(ray + 0x24);
      fStack_2698 = auVar10._8_4_ * -*(float *)(ray + 0x28);
      fStack_2694 = auVar10._12_4_ * -*(float *)(ray + 0x2c);
      fStack_2690 = -*(float *)(ray + 0x30) * 0.0;
      fStack_268c = -*(float *)(ray + 0x34) * 0.0;
      fStack_2688 = -*(float *)(ray + 0x38) * 0.0;
      uStack_26a4 = *(uint *)(ray + 0x5c) ^ 0x80000000;
      local_26c0 = auVar9._0_4_ * -*(float *)(ray + 0x40);
      fStack_26bc = auVar9._4_4_ * -*(float *)(ray + 0x44);
      fStack_26b8 = auVar9._8_4_ * -*(float *)(ray + 0x48);
      fStack_26b4 = auVar9._12_4_ * -*(float *)(ray + 0x4c);
      fStack_26b0 = -*(float *)(ray + 0x50) * 0.0;
      fStack_26ac = -*(float *)(ray + 0x54) * 0.0;
      fStack_26a8 = -*(float *)(ray + 0x58) * 0.0;
      uStack_2610 = 0xfffffffffffffff8;
      auStack_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      local_1e60 = local_2660;
      do {
        pauVar20 = pauVar20 + -1;
        uVar22 = puVar19[-1];
        puVar19 = puVar19 + -1;
        bVar12 = true;
        if (uVar22 != 0xfffffffffffffff8) {
          auVar26 = ZEXT3264(*pauVar20);
          auVar24 = vcmpps_avx(*pauVar20,local_27c0,1);
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            do {
              auVar24 = auVar26._0_32_;
              uVar21 = (uint)uVar22;
              local_2720 = auVar46._0_32_;
              local_2700 = auVar45._0_32_;
              local_26e0 = auVar44._0_32_;
              if ((uVar22 & 8) != 0) {
                if (uVar22 == 0xfffffffffffffff8) goto LAB_005c52db;
                auVar24 = vcmpps_avx(local_27c0,auVar24,6);
                auVar26 = ZEXT3264(auVar24);
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  uVar15 = (ulong)(uVar21 & 0xf);
                  if (uVar15 != 8) {
                    lVar16 = 0;
                    local_2740 = auVar24;
                    do {
                      local_2788.geomID = *(uint *)((uVar22 & 0xfffffffffffffff0) + lVar16 * 8);
                      local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
                      uVar21 = local_2758->mask;
                      auVar24._4_4_ = uVar21;
                      auVar24._0_4_ = uVar21;
                      auVar24._8_4_ = uVar21;
                      auVar24._12_4_ = uVar21;
                      auVar24._16_4_ = uVar21;
                      auVar24._20_4_ = uVar21;
                      auVar24._24_4_ = uVar21;
                      auVar24._28_4_ = uVar21;
                      auVar24 = vpand_avx2(auVar24,*(undefined1 (*) [32])(ray + 0x120));
                      auVar27 = vpcmpeqd_avx2(auVar24,_DAT_02020f00);
                      auVar24 = auVar26._0_32_ & ~auVar27;
                      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar24 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar24 >> 0x7f,0) != '\0') ||
                            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar24 >> 0xbf,0) != '\0') ||
                          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar24[0x1f] < '\0') {
                        local_2640 = vandnps_avx(auVar27,auVar26._0_32_);
                        local_2788.primID =
                             *(uint *)((uVar22 & 0xfffffffffffffff0) + 4 + lVar16 * 8);
                        local_2788.valid = (int *)local_2640;
                        local_2788.geometryUserPtr = local_2758->userPtr;
                        local_2788.context = context->user;
                        local_2788.N = 8;
                        local_2750 = 0;
                        local_2748 = context->args;
                        pp_Var13 = (_func_int **)local_2748->intersect;
                        if (pp_Var13 == (_func_int **)0x0) {
                          pp_Var13 = local_2758[1].super_RefCount._vptr_RefCount;
                        }
                        local_2788.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var13)(&local_2788);
                        auVar44 = ZEXT3264(local_26e0);
                        auVar45 = ZEXT3264(local_2700);
                        auVar46 = ZEXT3264(local_2720);
                        auVar47 = ZEXT3264(CONCAT428(0x7f800000,
                                                     CONCAT424(0x7f800000,
                                                               CONCAT420(0x7f800000,
                                                                         CONCAT416(0x7f800000,
                                                                                   CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar26 = ZEXT3264(local_2740);
                      }
                      auVar24 = auVar26._0_32_;
                      lVar16 = lVar16 + 1;
                    } while (uVar15 - 8 != lVar16);
                  }
                  local_27c0 = vblendvps_avx(local_27c0,*(undefined1 (*) [32])(ray + 0x100),auVar24)
                  ;
                }
                break;
              }
              uVar14 = uVar22 & 0xfffffffffffffff0;
              uVar18 = 0;
              auVar26 = ZEXT3264(auVar47._0_32_);
              uVar15 = 0;
              uVar22 = 8;
              do {
                uVar2 = *(ulong *)(uVar14 + uVar15 * 8);
                if (uVar2 != 8) {
                  uVar1 = *(undefined4 *)(uVar14 + 0x80 + uVar15 * 4);
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar30._16_4_ = uVar1;
                  auVar30._20_4_ = uVar1;
                  auVar30._24_4_ = uVar1;
                  auVar30._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar14 + 0x20 + uVar15 * 4);
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar25._16_4_ = uVar1;
                  auVar25._20_4_ = uVar1;
                  auVar25._24_4_ = uVar1;
                  auVar25._28_4_ = uVar1;
                  auVar27 = *(undefined1 (*) [32])(ray + 0xe0);
                  uVar1 = *(undefined4 *)(uVar14 + 0xa0 + uVar15 * 4);
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar36._16_4_ = uVar1;
                  auVar36._20_4_ = uVar1;
                  auVar36._24_4_ = uVar1;
                  auVar36._28_4_ = uVar1;
                  auVar11 = vfmadd231ps_fma(auVar25,auVar27,auVar30);
                  uVar1 = *(undefined4 *)(uVar14 + 0x40 + uVar15 * 4);
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar33._16_4_ = uVar1;
                  auVar33._20_4_ = uVar1;
                  auVar33._24_4_ = uVar1;
                  auVar33._28_4_ = uVar1;
                  auVar10 = vfmadd231ps_fma(auVar33,auVar27,auVar36);
                  uVar1 = *(undefined4 *)(uVar14 + 0xc0 + uVar15 * 4);
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar31._16_4_ = uVar1;
                  auVar31._20_4_ = uVar1;
                  auVar31._24_4_ = uVar1;
                  auVar31._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar14 + 0x60 + uVar15 * 4);
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  auVar37._16_4_ = uVar1;
                  auVar37._20_4_ = uVar1;
                  auVar37._24_4_ = uVar1;
                  auVar37._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar14 + 0x90 + uVar15 * 4);
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  auVar39._16_4_ = uVar1;
                  auVar39._20_4_ = uVar1;
                  auVar39._24_4_ = uVar1;
                  auVar39._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar14 + 0x30 + uVar15 * 4);
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar41._16_4_ = uVar1;
                  auVar41._20_4_ = uVar1;
                  auVar41._24_4_ = uVar1;
                  auVar41._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(auVar37,auVar27,auVar31);
                  auVar6 = vfmadd231ps_fma(auVar41,auVar27,auVar39);
                  uVar1 = *(undefined4 *)(uVar14 + 0xb0 + uVar15 * 4);
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar32._16_4_ = uVar1;
                  auVar32._20_4_ = uVar1;
                  auVar32._24_4_ = uVar1;
                  auVar32._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar14 + 0x50 + uVar15 * 4);
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar40._16_4_ = uVar1;
                  auVar40._20_4_ = uVar1;
                  auVar40._24_4_ = uVar1;
                  auVar40._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar14 + 0xd0 + uVar15 * 4);
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar42._16_4_ = uVar1;
                  auVar42._20_4_ = uVar1;
                  auVar42._24_4_ = uVar1;
                  auVar42._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(auVar40,auVar27,auVar32);
                  uVar1 = *(undefined4 *)(uVar14 + 0x70 + uVar15 * 4);
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  auVar43._16_4_ = uVar1;
                  auVar43._20_4_ = uVar1;
                  auVar43._24_4_ = uVar1;
                  auVar43._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(auVar43,auVar27,auVar42);
                  auVar5._4_4_ = fStack_267c;
                  auVar5._0_4_ = local_2680;
                  auVar5._8_4_ = fStack_2678;
                  auVar5._12_4_ = fStack_2674;
                  auVar5._16_4_ = fStack_2670;
                  auVar5._20_4_ = fStack_266c;
                  auVar5._24_4_ = fStack_2668;
                  auVar5._28_4_ = uStack_2664;
                  auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),local_2720,auVar5);
                  auVar4._4_4_ = fStack_269c;
                  auVar4._0_4_ = local_26a0;
                  auVar4._8_4_ = fStack_2698;
                  auVar4._12_4_ = fStack_2694;
                  auVar4._16_4_ = fStack_2690;
                  auVar4._20_4_ = fStack_268c;
                  auVar4._24_4_ = fStack_2688;
                  auVar4._28_4_ = uStack_2684;
                  auVar10 = vfmadd213ps_fma(ZEXT1632(auVar10),local_2700,auVar4);
                  auVar3._4_4_ = fStack_26bc;
                  auVar3._0_4_ = local_26c0;
                  auVar3._8_4_ = fStack_26b8;
                  auVar3._12_4_ = fStack_26b4;
                  auVar3._16_4_ = fStack_26b0;
                  auVar3._20_4_ = fStack_26ac;
                  auVar3._24_4_ = fStack_26a8;
                  auVar3._28_4_ = uStack_26a4;
                  auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),local_26e0,auVar3);
                  auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),local_2720,auVar5);
                  auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),local_2700,auVar4);
                  auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),local_26e0,auVar3);
                  auVar3 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar6));
                  auVar4 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                  auVar3 = vpmaxsd_avx2(auVar3,auVar4);
                  auVar4 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar8));
                  auVar4 = vpmaxsd_avx2(auVar3,auVar4);
                  auVar3 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar6));
                  auVar5 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                  auVar5 = vpminsd_avx2(auVar3,auVar5);
                  auVar3 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar8));
                  auVar3 = vpminsd_avx2(auVar3,local_27c0);
                  auVar5 = vpminsd_avx2(auVar5,auVar3);
                  auVar3 = vpmaxsd_avx2(auVar4,local_2660);
                  auVar3 = vcmpps_avx(auVar3,auVar5,2);
                  if ((uVar21 & 7) == 6) {
                    uVar1 = *(undefined4 *)(uVar14 + 0xe0 + uVar15 * 4);
                    auVar34._4_4_ = uVar1;
                    auVar34._0_4_ = uVar1;
                    auVar34._8_4_ = uVar1;
                    auVar34._12_4_ = uVar1;
                    auVar34._16_4_ = uVar1;
                    auVar34._20_4_ = uVar1;
                    auVar34._24_4_ = uVar1;
                    auVar34._28_4_ = uVar1;
                    auVar5 = vcmpps_avx(auVar34,auVar27,2);
                    uVar1 = *(undefined4 *)(uVar14 + 0xf0 + uVar15 * 4);
                    auVar38._4_4_ = uVar1;
                    auVar38._0_4_ = uVar1;
                    auVar38._8_4_ = uVar1;
                    auVar38._12_4_ = uVar1;
                    auVar38._16_4_ = uVar1;
                    auVar38._20_4_ = uVar1;
                    auVar38._24_4_ = uVar1;
                    auVar38._28_4_ = uVar1;
                    auVar27 = vcmpps_avx(auVar27,auVar38,1);
                    auVar27 = vandps_avx(auVar5,auVar27);
                    auVar27 = vandps_avx(auVar27,auVar3);
                    auVar11 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
                  }
                  else {
                    auVar11 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
                  }
                  auVar27 = vcmpps_avx(local_27c0,auVar24,6);
                  auVar10 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
                  auVar11 = vpand_avx(auVar11,auVar10);
                  auVar27 = vpmovzxwd_avx2(auVar11);
                  auVar27 = vpslld_avx2(auVar27,0x1f);
                  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0x7f,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0xbf,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar27[0x1f] < '\0') {
                    auVar27 = vblendvps_avx(auVar47._0_32_,auVar4,auVar27);
                    auVar25 = auVar26._0_32_;
                    auVar3 = vcmpps_avx(auVar27,auVar25,1);
                    uVar17 = uVar2;
                    auVar4 = auVar25;
                    auVar5 = auVar27;
                    if (((((((((auVar3 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                              (auVar3 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar3 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            SUB321(auVar3 >> 0x7f,0) == '\0') &&
                           (auVar3 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          SUB321(auVar3 >> 0xbf,0) == '\0') &&
                         (auVar3 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         -1 < auVar3[0x1f]) ||
                       (bVar23 = uVar22 != 8, uVar17 = uVar22, uVar22 = uVar2, auVar4 = auVar27,
                       auVar5 = auVar25, bVar23)) {
                      uVar18 = uVar18 + 1;
                      *puVar19 = uVar17;
                      puVar19 = puVar19 + 1;
                      *pauVar20 = auVar5;
                      pauVar20 = pauVar20 + 1;
                      auVar26 = ZEXT3264(auVar4);
                    }
                    else {
                      auVar26 = ZEXT3264(auVar27);
                    }
                  }
                }
              } while ((uVar2 != 8) && (bVar23 = uVar15 < 3, uVar15 = uVar15 + 1, bVar23));
              if (1 < uVar18 && uVar22 != 8) {
                auVar24 = pauVar20[-2];
                auVar27 = vcmpps_avx(auVar24,pauVar20[-1],1);
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0x7f,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0xbf,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar27[0x1f] < '\0') {
                  pauVar20[-2] = pauVar20[-1];
                  pauVar20[-1] = auVar24;
                  auVar11 = vpermilps_avx(*(undefined1 (*) [16])(puVar19 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar19 + -2) = auVar11;
                }
                if (uVar18 != 2) {
                  auVar24 = pauVar20[-3];
                  auVar27 = vcmpps_avx(auVar24,pauVar20[-1],1);
                  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0x7f,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0xbf,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar27[0x1f] < '\0') {
                    pauVar20[-3] = pauVar20[-1];
                    pauVar20[-1] = auVar24;
                    uVar15 = puVar19[-3];
                    puVar19[-3] = puVar19[-1];
                    puVar19[-1] = uVar15;
                  }
                  auVar24 = pauVar20[-3];
                  auVar27 = vcmpps_avx(auVar24,pauVar20[-2],1);
                  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0x7f,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0xbf,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar27[0x1f] < '\0') {
                    pauVar20[-3] = pauVar20[-2];
                    pauVar20[-2] = auVar24;
                    auVar11 = vpermilps_avx(*(undefined1 (*) [16])(puVar19 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar19 + -3) = auVar11;
                  }
                }
              }
            } while (uVar22 != 8);
          }
          bVar12 = false;
        }
LAB_005c52db:
      } while (!bVar12);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }